

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<float,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  byte bVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  
  bVar4 = (k->res).ulog2;
  iVar12 = nTxChan << (bVar4 & 0x1f);
  lVar7 = (long)iVar12 * (long)k->vw;
  if ((int)lVar7 != 0) {
    pfVar11 = (float *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 4);
    pfVar1 = pfVar11 + lVar7;
    pfVar5 = k->ku;
    pfVar8 = k->kv;
    lVar10 = (long)nTxChan;
    lVar7 = k->uw * lVar10;
    iVar9 = (int)lVar7;
    do {
      fVar14 = *pfVar5 * *pfVar11;
      lVar13 = lVar7 * 4;
      pfVar6 = pfVar5;
      if (iVar9 != nTxChan) {
        do {
          pfVar2 = pfVar11 + lVar10;
          pfVar11 = pfVar11 + lVar10;
          fVar14 = fVar14 + *pfVar2 * pfVar6[1];
          lVar13 = lVar13 + lVar10 * -4;
          pfVar6 = pfVar6 + 1;
        } while (lVar10 * 4 - lVar13 != 0);
      }
      fVar3 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *result = fVar14 * fVar3 + *result;
      pfVar11 = pfVar11 + lVar10 + (iVar12 - iVar9);
    } while (pfVar11 != pfVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }